

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O1

bool __thiscall xy_rect::hit(xy_rect *this,ray *r,double t0,double t1,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = (this->k - (r->orig).e[2]) / (r->dir).e[2];
  if ((t0 <= dVar6) && (dVar6 <= t1)) {
    dVar3 = (r->dir).e[0] * dVar6 + (r->orig).e[0];
    dVar1 = this->x0;
    if ((dVar1 <= dVar3) && (dVar3 <= this->x1)) {
      dVar4 = (r->dir).e[1] * dVar6 + (r->orig).e[1];
      dVar5 = this->y0;
      if ((dVar5 <= dVar4) && (dVar2 = this->y1, dVar4 <= dVar2)) {
        rec->u = (dVar3 - dVar1) / (this->x1 - dVar1);
        rec->v = (dVar4 - dVar5) / (dVar2 - dVar5);
        rec->t = dVar6;
        dVar3 = 0.0;
        dVar5 = (r->dir).e[0] * 0.0 + (r->dir).e[1] * 0.0 + (r->dir).e[2];
        rec->front_face = dVar5 < 0.0;
        dVar1 = *(double *)(&DAT_00124040 + (ulong)(dVar5 < 0.0) * 8);
        if (0.0 <= dVar5) {
          dVar3 = -0.0;
        }
        (rec->normal).e[0] = dVar3;
        (rec->normal).e[1] = dVar3;
        (rec->normal).e[2] = dVar1;
        (rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        dVar1 = (r->dir).e[1];
        dVar3 = (r->dir).e[2];
        dVar5 = (r->orig).e[1];
        dVar4 = (r->orig).e[2];
        (rec->p).e[0] = (r->dir).e[0] * dVar6 + (r->orig).e[0];
        (rec->p).e[1] = dVar1 * dVar6 + dVar5;
        (rec->p).e[2] = dVar6 * dVar3 + dVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool xy_rect::hit(const ray& r, double t0, double t1, hit_record& rec) const {
    auto t = (k-r.origin().z()) / r.direction().z();
    if (t < t0 || t > t1)
        return false;
    auto x = r.origin().x() + t*r.direction().x();
    auto y = r.origin().y() + t*r.direction().y();
    if (x < x0 || x > x1 || y < y0 || y > y1)
        return false;
    rec.u = (x-x0)/(x1-x0);
    rec.v = (y-y0)/(y1-y0);
    rec.t = t;
    vec3 outward_normal = vec3(0, 0, 1);
    rec.set_face_normal(r, outward_normal);
    rec.mat_ptr = mp;
    rec.p = r.at(t);
    return true;
}